

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckSqrtXnXmNonneg
          (Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,int res_var)

{
  double dVar1;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<double> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  Arguments *this_00;
  QuadAndLinTerms *pQVar5;
  size_t sVar6;
  MCType *this_01;
  undefined4 in_EDX;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  ConeArgs *in_RDI;
  QuadTerms *qpterms;
  Arguments *qe;
  QuadraticFunctionalConstraint *pConQfc;
  value_type arg_pow;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  **pConPow;
  ConeArgs *result;
  size_t in_stack_fffffffffffffeb8;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffec0;
  QuadTerms *this_02;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffed8;
  iterator pdVar7;
  size_type in_stack_fffffffffffffee0;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined8 local_e0;
  value_type local_d4;
  value_type *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined4 local_a0;
  value_type local_9c;
  undefined4 *local_98;
  undefined8 local_90;
  int local_88;
  int local_84;
  int *local_80;
  undefined8 local_78;
  QuadTerms *local_70;
  undefined8 local_68;
  QuadTerms **local_60;
  undefined8 local_58;
  QuadTerms *local_50;
  AlgebraicExpression<mp::QuadAndLinTerms> *local_48;
  QuadraticFunctionalConstraint *local_40;
  value_type local_38;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *local_28;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  **local_20;
  undefined1 local_15;
  undefined4 local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  ConeArgs::ConeArgs((ConeArgs *)in_stack_fffffffffffffec0);
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::MC(in_RSI);
  local_28 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             GetInitExpressionOfType<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                       (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  local_20 = &local_28;
  if (local_28 !=
      (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
       *)0x0) {
    CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
    GetParameters(&local_28->
                   super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                 );
    pvVar3 = std::array<double,_1UL>::operator[]
                       ((array<double,_1UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if ((*pvVar3 == 0.5) && (!NAN(*pvVar3))) {
      CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
      GetArguments(&(*local_20)->
                    super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
                  );
      pvVar4 = std::array<int,_1UL>::operator[]
                         ((array<int,_1UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_38 = *pvVar4;
      MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::MC(in_RSI);
      local_40 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::GetInitExpressionOfType<mp::QuadraticFunctionalConstraint>
                           (in_stack_fffffffffffffed8,
                            (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      if (local_40 == (QuadraticFunctionalConstraint *)0x0) {
        MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::MC(in_RSI);
        dVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::lb(in_stack_fffffffffffffec0,(int)(in_stack_fffffffffffffeb8 >> 0x20));
        if (0.0 <= dVar1) {
          local_c0 = 0x3ff0000000000000;
          local_b8 = &local_c0;
          local_b0 = 1;
          __l_02._M_len = in_stack_fffffffffffffee0;
          __l_02._M_array = (iterator)in_stack_fffffffffffffed8;
          std::vector<double,_std::allocator<double>_>::operator=(in_stack_fffffffffffffed0,__l_02);
          local_d4 = local_38;
          local_d0 = &local_d4;
          local_c8 = 1;
          __l_03._M_len = in_stack_fffffffffffffee0;
          __l_03._M_array = (iterator)in_stack_fffffffffffffed8;
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,__l_03);
          in_RDI->coef_extra = 1.0;
          local_ec = local_14;
          local_e8 = &local_ec;
          local_e0 = 1;
          __l_04._M_len = in_stack_fffffffffffffee0;
          __l_04._M_array = (iterator)in_stack_fffffffffffffed8;
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,__l_04);
        }
      }
      else {
        this_00 = QuadraticFunctionalConstraint::GetArguments
                            ((QuadraticFunctionalConstraint *)0x66943e);
        local_48 = this_00;
        dVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(this_00);
        if ((ABS(dVar1) == 0.0) && (!NAN(ABS(dVar1)))) {
          pQVar5 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_48);
          QuadAndLinTerms::GetLinTerms(pQVar5);
          bVar2 = LinTerms::empty((LinTerms *)0x66949d);
          if (bVar2) {
            pQVar5 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_48);
            QuadAndLinTerms::GetQPTerms(pQVar5);
            sVar6 = QuadTerms::size((QuadTerms *)0x6694c3);
            if (sVar6 == 1) {
              pQVar5 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_48);
              local_50 = QuadAndLinTerms::GetQPTerms(pQVar5);
              pdVar7 = (iterator)
                       QuadTerms::coef((QuadTerms *)in_stack_fffffffffffffec0,
                                       (int)(in_stack_fffffffffffffeb8 >> 0x20));
              if (0.0 <= (double)pdVar7) {
                this_01 = MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          ::MC(in_RSI);
                QuadTerms::var1((QuadTerms *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
                dVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        ::lb(in_stack_fffffffffffffec0,(int)(in_stack_fffffffffffffeb8 >> 0x20));
                if (0.0 <= dVar1) {
                  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ::MC(in_RSI);
                  QuadTerms::var2((QuadTerms *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
                  var = (int)(in_stack_fffffffffffffeb8 >> 0x20);
                  dVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          ::lb(in_stack_fffffffffffffec0,var);
                  if (0.0 <= dVar1) {
                    this_02 = (QuadTerms *)
                              QuadTerms::coef((QuadTerms *)in_stack_fffffffffffffec0,var);
                    local_68 = 0x3ff0000000000000;
                    local_60 = &local_70;
                    local_58 = 2;
                    __l._M_len = (size_type)this_00;
                    __l._M_array = pdVar7;
                    local_70 = this_02;
                    std::vector<double,_std::allocator<double>_>::operator=
                              ((vector<double,_std::allocator<double>_> *)this_01,__l);
                    sVar6 = 0;
                    local_88 = QuadTerms::var1(this_02,0);
                    local_84 = QuadTerms::var2(this_02,sVar6);
                    local_80 = &local_88;
                    local_78 = 2;
                    __l_00._M_len = (size_type)this_00;
                    __l_00._M_array = (iterator)pdVar7;
                    std::vector<int,_std::allocator<int>_>::operator=
                              ((vector<int,_std::allocator<int>_> *)this_01,__l_00);
                    local_a0 = local_14;
                    local_9c = local_38;
                    local_98 = &local_a0;
                    local_90 = 2;
                    __l_01._M_len = (size_type)this_00;
                    __l_01._M_array = (iterator)pdVar7;
                    std::vector<int,_std::allocator<int>_>::operator=
                              ((vector<int,_std::allocator<int>_> *)this_01,__l_01);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

ConeArgs CheckSqrtXnXmNonneg(int res_var) {
    ConeArgs result;
    if (const auto& pConPow = MC().template
        GetInitExpressionOfType<PowConstExpConstraint>(res_var)) {
      if (0.5 == pConPow->GetParameters()[0]) {     // sqrt(arg_pow)
        const auto arg_pow = pConPow->GetArguments()[0];
        if (auto pConQfc = MC().template
            GetInitExpressionOfType<           // arg_pow := QuadExpr
            QuadraticFunctionalConstraint>(arg_pow)) {
          const auto& qe = pConQfc->GetArguments();
          if (0.0 == std::fabs(qe.constant_term()) &&
              qe.GetBody().GetLinTerms().empty() &&
              1 == qe.GetBody().GetQPTerms().size()) {
            const auto& qpterms = qe.GetBody().GetQPTerms();
            if (qpterms.coef(0) >= 0.0 &&  // don't check if diff vars
                MC().lb(qpterms.var1(0)) >= 0.0 &&
                MC().lb(qpterms.var2(0)) >= 0.0) {
              result.coefs_ = {qpterms.coef(0), 1.0};
              result.vars_ = {qpterms.var1(0), qpterms.var2(0)};
              result.res_vars_to_delete_ = {res_var, arg_pow};
              return result;
            }
          }
        } else {        // It's just some variable
          if (MC().lb(arg_pow) >= 0.0) {
            result.coefs_ = {1.0};
            result.vars_ = {arg_pow};
            result.coef_extra = 1.0;   // for a new fixed var
            result.res_vars_to_delete_ = {res_var};
            return result;
          }
        }
      }
    }
    return result;
  }